

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * __thiscall
fmt::v11::detail::do_format_base2e<char,unsigned__int128>
          (detail *this,int base_bits,char *out,unsigned___int128 value,int size,bool upper)

{
  char cVar1;
  uint uVar2;
  undefined4 in_register_0000000c;
  long lVar3;
  undefined4 in_register_00000034;
  undefined3 in_register_00000081;
  int in_R9D;
  char *pcVar4;
  char *pcVar5;
  undefined1 auVar6 [16];
  
  lVar3 = CONCAT44(in_register_0000000c,size);
  pcVar5 = (char *)((long)CONCAT31(in_register_00000081,upper) +
                   CONCAT44(in_register_00000034,base_bits));
  pcVar4 = "0123456789abcdef";
  if (in_R9D != 0) {
    pcVar4 = "0123456789ABCDEF";
  }
  do {
    uVar2 = (uint)out & ~(-1 << ((byte)this & 0x1f));
    if ((int)this < 4) {
      cVar1 = (char)uVar2 + '0';
    }
    else {
      cVar1 = pcVar4[uVar2];
    }
    pcVar5[-1] = cVar1;
    pcVar5 = pcVar5 + -1;
    auVar6 = __lshrti3(out,lVar3,(ulong)this & 0xff);
    lVar3 = auVar6._8_8_;
    out = auVar6._0_8_;
  } while (out != (char *)0x0 || lVar3 != 0);
  return pcVar5;
}

Assistant:

FMT_CONSTEXPR auto do_format_base2e(int base_bits, Char* out, UInt value,
                                    int size, bool upper = false) -> Char* {
  out += size;
  do {
    const char* digits = upper ? "0123456789ABCDEF" : "0123456789abcdef";
    unsigned digit = static_cast<unsigned>(value & ((1 << base_bits) - 1));
    *--out = static_cast<Char>(base_bits < 4 ? static_cast<char>('0' + digit)
                                             : digits[digit]);
  } while ((value >>= base_bits) != 0);
  return out;
}